

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  secp256k1_scratch *scratch;
  ulong extraout_RAX;
  code *pcVar5;
  long lVar6;
  secp256k1_strauss_point_state *psVar7;
  long extraout_RDX;
  ulong uVar8;
  secp256k1_strauss_point_state *scratch_00;
  size_t sVar9;
  secp256k1_gej *r;
  secp256k1_gej *psVar10;
  ulong uVar11;
  secp256k1_strauss_point_state *psVar12;
  byte *out32;
  secp256k1_gej *psVar13;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_gej *psVar14;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *hash_00;
  secp256k1_callback *error_callback;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar15;
  secp256k1_sha256 *acc;
  secp256k1_strauss_point_state *r_00;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej pj;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_2090;
  secp256k1_strauss_state sStack_2078;
  secp256k1_fe asStack_2060 [8];
  secp256k1_strauss_point_state sStack_1f20;
  secp256k1_ge asStack_1b10 [8];
  secp256k1_callback *psStack_1840;
  secp256k1_gej *psStack_1838;
  secp256k1_strauss_point_state *psStack_1830;
  secp256k1_strauss_point_state *psStack_1828;
  secp256k1_strauss_point_state *psStack_1820;
  secp256k1_strauss_point_state *psStack_1810;
  undefined1 auStack_17f8 [8];
  undefined1 auStack_17f0 [88];
  secp256k1_gej sStack_1798;
  secp256k1_gej sStack_1718;
  secp256k1_gej sStack_1698;
  secp256k1_gej sStack_1618;
  secp256k1_gej asStack_1598 [2];
  secp256k1_strauss_point_state sStack_1458;
  secp256k1_gej sStack_1048;
  secp256k1_gej sStack_fc8;
  undefined1 auStack_f48 [720];
  secp256k1_sha256 *psStack_c78;
  secp256k1_scratch *psStack_c70;
  secp256k1_sha256 *psStack_c68;
  secp256k1_gej *psStack_c60;
  code *pcStack_c58;
  int iStack_c4e;
  undefined2 uStack_c4a;
  long lStack_c48;
  byte abStack_c40 [32];
  undefined1 auStack_c20 [40];
  uchar auStack_bf8 [88];
  int aiStack_ba0 [4];
  secp256k1_sha256 sStack_b90;
  secp256k1_gej *psStack_b28;
  secp256k1_fe *psStack_b20;
  secp256k1_ge *psStack_b18;
  secp256k1_ge *psStack_b10;
  secp256k1_gej *psStack_b08;
  secp256k1_strauss_point_state *psStack_b00;
  undefined1 auStack_af8 [32];
  undefined1 local_ad8 [40];
  uint64_t uStack_ab0;
  uint64_t local_aa8;
  uint64_t uStack_aa0;
  uint64_t local_a98;
  uint64_t local_a90;
  uint64_t uStack_a88;
  uint64_t local_a80;
  uint64_t uStack_a78;
  uint64_t local_a70;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  int local_a40;
  secp256k1_strauss_state local_a38;
  secp256k1_gej local_a20;
  secp256k1_gej local_9a0;
  secp256k1_gej local_920;
  secp256k1_ge local_8a0;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar10 = (secp256k1_gej *)auStack_af8;
  psVar12 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar15 = (secp256k1_scalar *)local_ad8;
  psStack_b00 = (secp256k1_strauss_point_state *)0x16a9f0;
  testutil_random_scalar_order_test(psVar15);
  psStack_b00 = (secp256k1_strauss_point_state *)0x16aa01;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_af8,psVar15,target);
  psStack_b00 = (secp256k1_strauss_point_state *)0x16aa0c;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_af8,(secp256k1_scalar *)auStack_af8);
  if (mode == 0) {
    psStack_b00 = (secp256k1_strauss_point_state *)0x16ab61;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_920,(secp256k1_scalar *)local_ad8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x16ab78;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9a0,(secp256k1_scalar *)auStack_af8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x16ab8f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_a20,target);
  }
  else {
    psStack_b00 = (secp256k1_strauss_point_state *)0x16aa24;
    testutil_random_ge_test(&local_8a0);
    local_a40 = local_8a0.infinity;
    local_ad8._32_8_ = local_8a0.x.n[0];
    uStack_ab0 = local_8a0.x.n[1];
    local_aa8 = local_8a0.x.n[2];
    uStack_aa0 = local_8a0.x.n[3];
    local_a98 = local_8a0.x.n[4];
    local_a90 = local_8a0.y.n[0];
    uStack_a88 = local_8a0.y.n[1];
    local_a80 = local_8a0.y.n[2];
    uStack_a78 = local_8a0.y.n[3];
    local_a70 = local_8a0.y.n[4];
    local_a68 = 1;
    local_a60 = 0;
    uStack_a58 = 0;
    local_a50 = 0;
    uStack_a48 = 0;
    if (mode == 1) {
      unaff_R12 = local_848;
      unaff_R13 = local_708;
      psVar12 = &local_448;
      psVar15 = &secp256k1_scalar_zero;
      psVar10 = (secp256k1_gej *)(local_ad8 + 0x20);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16aae7;
      local_9a0.x.n[0] = (uint64_t)unaff_R12;
      local_9a0.x.n[1] = (uint64_t)unaff_R13;
      local_9a0.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_9a0,&local_920,1,psVar10,
                 (secp256k1_scalar *)local_ad8,&secp256k1_scalar_zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16ab15;
      local_a20.x.n[0] = (uint64_t)unaff_R12;
      local_a20.x.n[1] = (uint64_t)unaff_R13;
      local_a20.x.n[2] = (uint64_t)psVar12;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_a20,&local_9a0,1,psVar10,
                 (secp256k1_scalar *)auStack_af8,&secp256k1_scalar_zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16ab43;
      local_a38.aux = unaff_R12;
      local_a38.pre_a = unaff_R13;
      local_a38.ps = psVar12;
      secp256k1_ecmult_strauss_wnaf(&local_a38,&local_a20,1,psVar10,target,&secp256k1_scalar_zero);
    }
    else {
      psVar15 = (secp256k1_scalar *)&local_8a0;
      psStack_b00 = (secp256k1_strauss_point_state *)0x16abae;
      secp256k1_ecmult_const(&local_920,(secp256k1_ge *)psVar15,(secp256k1_scalar *)local_ad8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16abc1;
      secp256k1_ecmult_const(&local_9a0,(secp256k1_ge *)psVar15,(secp256k1_scalar *)auStack_af8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16abd4;
      secp256k1_ecmult_const(&local_a20,(secp256k1_ge *)psVar15,target);
      psVar10 = (secp256k1_gej *)auStack_af8;
    }
  }
  psStack_b00 = (secp256k1_strauss_point_state *)0x16abf1;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_920,(secp256k1_fe *)0x0);
  psStack_b00 = (secp256k1_strauss_point_state *)0x16ac06;
  psVar13 = &local_a20;
  psVar14 = &local_a20;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_9a0,(secp256k1_fe *)0x0);
  if (local_a20.infinity != 0) {
    return;
  }
  psStack_b00 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar14 & 0xffffffff);
  pcStack_c58 = (code *)0x16ac54;
  lStack_c48 = extraout_RDX;
  psStack_b28 = &local_a20;
  psStack_b20 = unaff_R12;
  psStack_b18 = unaff_R13;
  psStack_b10 = (secp256k1_ge *)psVar15;
  psStack_b08 = psVar10;
  psStack_b00 = psVar12;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  iStack_c4e = (int)psVar14;
  acc = &sStack_b90;
  sStack_b90.s[0] = 0x6a09e667;
  sStack_b90.s[1] = 0xbb67ae85;
  sStack_b90.s[2] = 0x3c6ef372;
  sStack_b90.s[3] = 0xa54ff53a;
  sStack_b90.s[4] = 0x510e527f;
  sStack_b90.s[5] = 0x9b05688c;
  sStack_b90.s[6] = 0x1f83d9ab;
  sStack_b90.s[7] = 0x5be0cd19;
  psVar10 = (secp256k1_gej *)0x0;
  sStack_b90.bytes = 0;
  hash_00 = (secp256k1_sha256 *)auStack_c20;
  auStack_c20._0_4_ = 0;
  auStack_c20._4_4_ = 0;
  auStack_c20._8_4_ = 0;
  auStack_c20._12_4_ = 0;
  auStack_c20._16_4_ = 0;
  auStack_c20._20_4_ = 0;
  auStack_c20._24_4_ = 0;
  auStack_c20._28_4_ = 0;
  pcStack_c58 = (code *)0x16aca1;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  auStack_c20._0_4_ = 1;
  auStack_c20._4_4_ = 0;
  auStack_c20._8_4_ = 0;
  auStack_c20._12_4_ = 0;
  auStack_c20._16_4_ = 0;
  auStack_c20._20_4_ = 0;
  auStack_c20._24_4_ = 0;
  auStack_c20._28_4_ = 0;
  pcStack_c58 = (code *)0x16acc5;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  pcStack_c58 = (code *)0x16acd0;
  secp256k1_scalar_negate((secp256k1_scalar *)hash_00,(secp256k1_scalar *)hash_00);
  pcStack_c58 = (code *)0x16acde;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash_00,scratch);
  if (psVar13 != (secp256k1_gej *)0x0) {
    psVar10 = (secp256k1_gej *)0x0;
    hash_00 = (secp256k1_sha256 *)(auStack_c20 + 0x20);
    out32 = abStack_c40;
    acc = (secp256k1_sha256 *)auStack_c20;
    do {
      uStack_c4a = SUB82(psVar10,0);
      auStack_c20[0x20] = 'g';
      auStack_c20[0x21] = 0xe6;
      auStack_c20[0x22] = '\t';
      auStack_c20[0x23] = 'j';
      auStack_c20[0x24] = 0x85;
      auStack_c20[0x25] = 0xae;
      auStack_c20[0x26] = 'g';
      auStack_c20[0x27] = 0xbb;
      auStack_bf8[0] = 'r';
      auStack_bf8[1] = 0xf3;
      auStack_bf8[2] = 'n';
      auStack_bf8[3] = '<';
      auStack_bf8[4] = ':';
      auStack_bf8[5] = 0xf5;
      auStack_bf8[6] = 'O';
      auStack_bf8[7] = 0xa5;
      auStack_bf8[8] = '\x7f';
      auStack_bf8[9] = 'R';
      auStack_bf8[10] = '\x0e';
      auStack_bf8[0xb] = 'Q';
      auStack_bf8[0xc] = 0x8c;
      auStack_bf8[0xd] = 'h';
      auStack_bf8[0xe] = '\x05';
      auStack_bf8[0xf] = 0x9b;
      auStack_bf8[0x10] = 0xab;
      auStack_bf8[0x11] = 0xd9;
      auStack_bf8[0x12] = 0x83;
      auStack_bf8[0x13] = '\x1f';
      auStack_bf8[0x14] = '\x19';
      auStack_bf8[0x15] = 0xcd;
      auStack_bf8[0x16] = 0xe0;
      auStack_bf8[0x17] = '[';
      aiStack_ba0[0] = 0;
      aiStack_ba0[1] = 0;
      pcStack_c58 = (code *)0x16ad2f;
      secp256k1_sha256_write(hash_00,(uchar *)&iStack_c4e,6);
      pcStack_c58 = (code *)0x16ad3a;
      secp256k1_sha256_finalize(hash_00,out32);
      pcStack_c58 = (code *)0x16ad47;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_c58 = (code *)0x16ad5a;
      test_ecmult_accumulate(&sStack_b90,(secp256k1_scalar *)acc,scratch);
      psVar10 = (secp256k1_gej *)((long)(psVar10->x).n + 1);
    } while (psVar13 != psVar10);
  }
  pcStack_c58 = (code *)0x16ad74;
  secp256k1_sha256_finalize(&sStack_b90,abStack_c40);
  lVar6 = 0;
  uVar11 = extraout_RAX;
  do {
    uVar8 = uVar11 & 0xffffffff;
    bVar2 = abStack_c40[lVar6];
    psVar12 = (secp256k1_strauss_point_state *)(ulong)bVar2;
    bVar3 = *(byte *)(lStack_c48 + lVar6);
    hash = (secp256k1_sha256 *)(ulong)bVar3;
    uVar11 = (ulong)((uint)bVar2 - (uint)bVar3);
    if (bVar2 == bVar3) {
      uVar11 = uVar8;
    }
    iVar4 = (int)uVar11;
    if (bVar2 != bVar3) goto LAB_0016ad9e;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  iVar4 = 0;
LAB_0016ad9e:
  if (iVar4 == 0) {
    pcStack_c58 = (code *)0x16adb6;
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  pcStack_c58 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_17f8 = (undefined1  [8])0x41;
  sStack_fc8.infinity = 0;
  sStack_fc8.x.n[0] = 0x2815b16f81798;
  sStack_fc8.x.n[1] = 0xdb2dce28d959f;
  sStack_fc8.x.n[2] = 0xe870b07029bfc;
  sStack_fc8.x.n[3] = 0xbbac55a06295c;
  sStack_fc8.x.n[4] = 0x79be667ef9dc;
  sStack_fc8.y.n[4] = 0x483ada7726a3;
  sStack_fc8.y.n[0] = 0x7d08ffb10d4b8;
  sStack_fc8.y.n[1] = 0x48a68554199c4;
  sStack_fc8.y.n[2] = 0xe1108a8fd17b4;
  sStack_fc8.y.n[3] = 0xc4655da4fbfc0;
  sStack_fc8.z.n[0] = 1;
  sStack_fc8.z.n[1] = 0;
  sStack_fc8.z.n[2] = 0;
  sStack_fc8.z.n[3] = 0;
  sStack_fc8.z.n[4] = 0;
  sStack_1048.infinity = 1;
  sStack_1048.z.n[4] = 0;
  sStack_1048.z.n[2] = 0;
  sStack_1048.z.n[3] = 0;
  sStack_1048.z.n[0] = 0;
  sStack_1048.z.n[1] = 0;
  sStack_1048.y.n[3] = 0;
  sStack_1048.y.n[4] = 0;
  sStack_1048.y.n[1] = 0;
  sStack_1048.y.n[2] = 0;
  sStack_1048.x.n[4] = 0;
  sStack_1048.y.n[0] = 0;
  sStack_1048.x.n[2] = 0;
  sStack_1048.x.n[3] = 0;
  sStack_1048.x.n[0] = 0;
  sStack_1048.x.n[1] = 0;
  psStack_1820 = (secp256k1_strauss_point_state *)0x16aebe;
  auStack_f48._712_8_ = psVar10;
  psStack_c78 = hash_00;
  psStack_c70 = scratch;
  psStack_c68 = acc;
  psStack_c60 = psVar13;
  pcStack_c58 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1618,(secp256k1_scalar *)psVar12);
  r_00 = (secp256k1_strauss_point_state *)auStack_f48;
  psStack_1820 = (secp256k1_strauss_point_state *)0x16af0b;
  sStack_1718.x.n[0] = (uint64_t)asStack_1598;
  sStack_1718.x.n[1] = (uint64_t)r_00;
  sStack_1718.x.n[2] = (uint64_t)&sStack_1458;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1718,&sStack_1698,1,&sStack_fc8,
             (secp256k1_scalar *)psVar12,&secp256k1_scalar_zero);
  psStack_1820 = (secp256k1_strauss_point_state *)0x16af3e;
  sStack_1798.x.n[0] = (uint64_t)asStack_1598;
  sStack_1798.x.n[1] = (uint64_t)r_00;
  sStack_1798.x.n[2] = (uint64_t)&sStack_1458;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1798,&sStack_1718,1,&sStack_1048,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar12);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_1820 = (secp256k1_strauss_point_state *)0x16af6d;
  psVar15 = (secp256k1_scalar *)psVar12;
  scratch_01 = scratch_00;
  iVar4 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_f48,(secp256k1_scalar *)psVar12,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar4 == 0) {
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b14a;
    test_ecmult_accumulate_cold_8();
LAB_0016b14a:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b14f;
    test_ecmult_accumulate_cold_7();
LAB_0016b14f:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b154;
    test_ecmult_accumulate_cold_6();
LAB_0016b154:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b159;
    test_ecmult_accumulate_cold_5();
LAB_0016b159:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b15e;
    test_ecmult_accumulate_cold_4();
LAB_0016b15e:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b163;
    test_ecmult_accumulate_cold_3();
LAB_0016b163:
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b168;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar15 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16afa8;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar12;
    iVar4 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1598,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar12,1);
    if (iVar4 == 0) goto LAB_0016b14a;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16afc7;
    secp256k1_ecmult_const(&sStack_1798,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar12);
    psVar12 = (secp256k1_strauss_point_state *)auStack_17f0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16afdc;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar12,&sStack_1618);
    r_00 = &sStack_1458;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16aff4;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_1698);
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b004;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar12,
               (secp256k1_fe *)0x0);
    if (sStack_1458.wnaf_na_1[0x1e] == 0) goto LAB_0016b14f;
    psVar12 = &sStack_1458;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b027;
    secp256k1_gej_neg((secp256k1_gej *)psVar12,&sStack_1718);
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b039;
    scratch_01 = psVar12;
    elem = psVar12;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar12,(secp256k1_gej *)psVar12,(secp256k1_ge *)auStack_17f0,
               (secp256k1_fe *)0x0);
    if (sStack_1458.wnaf_na_1[0x1e] == 0) goto LAB_0016b154;
    psVar12 = &sStack_1458;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b05c;
    secp256k1_gej_neg((secp256k1_gej *)psVar12,(secp256k1_gej *)auStack_f48);
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b06e;
    scratch_01 = psVar12;
    elem = psVar12;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar12,(secp256k1_gej *)psVar12,(secp256k1_ge *)auStack_17f0,
               (secp256k1_fe *)0x0);
    if (sStack_1458.wnaf_na_1[0x1e] == 0) goto LAB_0016b159;
    psVar12 = &sStack_1458;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b091;
    secp256k1_gej_neg((secp256k1_gej *)psVar12,asStack_1598);
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b0a3;
    scratch_01 = psVar12;
    elem = psVar12;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar12,(secp256k1_gej *)psVar12,(secp256k1_ge *)auStack_17f0,
               (secp256k1_fe *)0x0);
    if (sStack_1458.wnaf_na_1[0x1e] == 0) goto LAB_0016b15e;
    psVar12 = &sStack_1458;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b0c6;
    secp256k1_gej_neg((secp256k1_gej *)psVar12,&sStack_1798);
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b0d8;
    scratch_01 = psVar12;
    elem = psVar12;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar12,(secp256k1_gej *)psVar12,(secp256k1_ge *)auStack_17f0,
               (secp256k1_fe *)0x0);
    if (sStack_1458.wnaf_na_1[0x1e] == 0) goto LAB_0016b163;
    if (auStack_17f0._80_4_ != 0) {
      sStack_1458.wnaf_na_1[0]._0_1_ = 0;
      sVar9 = 1;
LAB_0016b129:
      psStack_1820 = (secp256k1_strauss_point_state *)0x16b133;
      secp256k1_sha256_write(hash,(uchar *)&sStack_1458,sVar9);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_17f0;
    scratch_01 = &sStack_1458;
    psVar12 = (secp256k1_strauss_point_state *)auStack_17f8;
    psVar15 = (secp256k1_scalar *)0x0;
    psStack_1820 = (secp256k1_strauss_point_state *)0x16b118;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar12,0);
    if (auStack_17f8 == (undefined1  [8])0x41) {
      sVar9 = 0x41;
      goto LAB_0016b129;
    }
  }
  psStack_1820 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)psVar15 != (secp256k1_strauss_point_state *)0x0 ||
      psStack_1810 != (secp256k1_strauss_point_state *)0x0) {
    psStack_1840 = error_callback;
    psStack_1838 = &sStack_1048;
    psStack_1830 = psVar12;
    psStack_1828 = r_00;
    psStack_1820 = &sStack_1458;
    if (psStack_1810 != (secp256k1_strauss_point_state *)0x0) {
      if (scratch_01 != (secp256k1_strauss_point_state *)0x0) {
        sVar9 = secp256k1_pippenger_max_points
                          ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01);
        if (sVar9 != 0) {
          uVar11 = 5000000;
          if (sVar9 < 5000000) {
            uVar11 = sVar9;
          }
          puVar1 = (undefined1 *)((long)psStack_1810[-1].wnaf_na_lam + 0x20b);
          uStack_2090 = (ulong)puVar1 / uVar11 + 1;
          r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_2090 + 1);
        }
        if (sVar9 != 0) {
          if (r_00 < (secp256k1_strauss_point_state *)0x58) {
            sVar9 = secp256k1_scratch_max_allocation
                              ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01,5);
            if (0x8af < sVar9) {
              uVar11 = sVar9 / 0x8b0;
              if (4999999 < uVar11) {
                uVar11 = 5000000;
              }
              puVar1 = (undefined1 *)((long)psStack_1810[-1].wnaf_na_lam + 0x20b);
              uStack_2090 = (ulong)puVar1 / uVar11 + 1;
              r_00 = (secp256k1_strauss_point_state *)((ulong)puVar1 / uStack_2090 + 1);
            }
            if (sVar9 < 0x8b0) goto LAB_0016b325;
            pcVar5 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar5 = secp256k1_ecmult_pippenger_batch;
          }
          lVar6 = 0;
          uVar11 = 0;
          while( true ) {
            psVar12 = r_00;
            if (psStack_1810 < r_00) {
              psVar12 = psStack_1810;
            }
            psVar7 = (secp256k1_strauss_point_state *)0x0;
            if (uVar11 == 0) {
              psVar7 = (secp256k1_strauss_point_state *)psVar15;
            }
            iVar4 = (*pcVar5)(elem,scratch_01,&sStack_1f20,psVar7,cb,cbdata,psVar12,lVar6);
            if (iVar4 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f20,(secp256k1_fe *)0x0);
            psStack_1810 = (secp256k1_strauss_point_state *)((long)psStack_1810 - (long)psVar12);
            uVar11 = uVar11 + 1;
            lVar6 = (long)((secp256k1_fe *)r_00->wnaf_na_1)->n + lVar6;
            if (uStack_2090 == uVar11) {
              return;
            }
          }
          return;
        }
      }
LAB_0016b325:
      secp256k1_ecmult_multi_simple_var(r,psVar15,cb,cbdata,(size_t)psStack_1810);
      return;
    }
    sStack_2078.aux = asStack_2060;
    sStack_2078.pre_a = asStack_1b10;
    sStack_2078.ps = &sStack_1f20;
    secp256k1_ecmult_strauss_wnaf(&sStack_2078,r,1,r,&secp256k1_scalar_zero,psVar15);
  }
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}